

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall MessageQueue::MessageQueue(MessageQueue *this,Path *path,CreateFlag flag)

{
  int iVar1;
  char *__pathname;
  element_type *this_00;
  shared_ptr<MessageThread> local_48;
  uint local_34;
  key_t local_30;
  int flg;
  key_t key;
  CreateFlag local_1c;
  String *pSStack_18;
  CreateFlag flag_local;
  Path *path_local;
  MessageQueue *this_local;
  
  this->queue = -1;
  this->owner = false;
  local_1c = flag;
  pSStack_18 = &path->super_String;
  path_local = (Path *)this;
  Signal<std::function<void_(const_Buffer_&)>_>::Signal(&this->signalDataAvailable);
  std::shared_ptr<MessageThread>::shared_ptr(&this->thread);
  pthread_once(&msgInitOnce,msgInit);
  __pathname = String::nullTerminated(pSStack_18);
  local_30 = ftok(__pathname,0xf6b);
  if (local_30 != -1) {
    local_34 = 0;
    if (local_1c == Create) {
      local_34 = 0x600;
    }
    iVar1 = msgget(local_30,local_34);
    this->queue = iVar1;
    this->owner = (bool)((byte)(local_34 >> 9) & 1);
    std::make_shared<MessageThread,int&,MessageQueue*>((int *)&local_48,(MessageQueue **)this);
    std::shared_ptr<MessageThread>::operator=(&this->thread,&local_48);
    std::shared_ptr<MessageThread>::~shared_ptr(&local_48);
    this_00 = std::__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->thread);
    Thread::start(&this_00->super_Thread,Normal,0);
  }
  return;
}

Assistant:

MessageQueue::MessageQueue(const Path& path, CreateFlag flag)
    : queue(-1), owner(false)
{
    pthread_once(&msgInitOnce, msgInit);
    const key_t key = ftok(path.nullTerminated(), PROJID);
    if (key == -1)
        return;
    const int flg = (flag == Create) ? (IPC_CREAT | IPC_EXCL) : 0;
    queue = msgget(key, flg);
    owner = ((flg & IPC_CREAT) == IPC_CREAT);
    thread = std::make_shared<MessageThread>(queue, this);
    thread->start();
}